

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuLaunchData.cpp
# Opt level: O2

bool __thiscall xmrig::CpuLaunchData::isEqual(CpuLaunchData *this,CpuLaunchData *other)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = memcmp(this,other,6);
  if (((iVar1 == 0) && (this->intensity == other->intensity)) && (this->priority == other->priority)
     ) {
    bVar2 = this->affinity == other->affinity;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool xmrig::CpuLaunchData::isEqual(const CpuLaunchData &other) const
{
    return (assembly            == other.assembly
            && hugePages        == other.hugePages
            && hwAES            == other.hwAES
            && intensity        == other.intensity
            && priority         == other.priority
            && affinity         == other.affinity
            );
}